

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

SP __thiscall
pbrt::SingleLevelFlattener::getOrCreateEmittedShapeFrom(SingleLevelFlattener *this,SP *object)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  pointer psVar6;
  map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  *this_00;
  SP SVar7;
  SP ours;
  shared_ptr<pbrt::Shape> geom;
  undefined1 local_69;
  Object *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  element_type *local_38;
  
  peVar1 = ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
           &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
  if ((peVar1->shapes).
      super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (peVar1->shapes).
      super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
               *)(object + 1);
    pmVar5 = std::
             map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
             ::operator[](this_00,(key_type *)in_RDX._M_pi);
    if ((pmVar5->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) {
      std::operator+(&local_58,"ShapeFrom:",
                     &((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
                      &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr->name);
      local_68 = (Object *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<pbrt::Object,std::allocator<pbrt::Object>,std::__cxx11::string>
                (&local_60,&local_68,(allocator<pbrt::Object> *)&local_69,&local_58);
      local_38 = (element_type *)this;
      std::__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<pbrt::Object,pbrt::Object>
                ((__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2> *)&local_68,local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      peVar1 = ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
               &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
      psVar6 = (peVar1->shapes).
               super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar3 = (peVar1->shapes).
               super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar6 != psVar3) {
        do {
          local_58._M_dataplus._M_p =
               (pointer)(psVar6->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          local_58._M_string_length =
               (size_type)
               (psVar6->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_58._M_string_length)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_58._M_string_length)->_M_use_count + 1;
            }
          }
          std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
          ::push_back(&local_68->shapes,(value_type *)&local_58);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
          }
          psVar6 = psVar6 + 1;
        } while (psVar6 != psVar3);
      }
      pmVar5 = std::
               map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
               ::operator[](this_00,(key_type *)in_RDX._M_pi);
      (pmVar5->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_68;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar5->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                 ,&local_60);
      this = (SingleLevelFlattener *)local_38;
      ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
      &(local_38->super_Entity)._vptr_Entity)->_M_ptr =
           (pmVar5->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar4 = (element_type *)
               (pmVar5->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      (local_38->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
      super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
      if (peVar4 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peVar4->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar4->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                        super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(peVar4->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar4->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                        super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      in_RDX._M_pi = extraout_RDX_00;
      if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
        in_RDX._M_pi = extraout_RDX_01;
      }
    }
    else {
      pmVar5 = std::
               map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
               ::operator[](this_00,(key_type *)in_RDX._M_pi);
      (this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pmVar5->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var2 = (pmVar5->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      (this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = p_Var2;
      in_RDX._M_pi = extraout_RDX;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
    }
  }
  SVar7.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar7.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar7.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Object::SP
    getOrCreateEmittedShapeFrom(Object::SP object)
    {
      if (object->shapes.empty()) return Object::SP();
      if (alreadyEmitted[object]) return alreadyEmitted[object];
      
      Object::SP ours = std::make_shared<Object>("ShapeFrom:"+object->name);
      for (auto geom : object->shapes)
        ours->shapes.push_back(geom);
      // light sources in instantiated objects aren't handled yet ...
      // for (auto lightSource : object->lightSources)
      //   ours->lightSources.push_back(lightSource);

      return alreadyEmitted[object] = ours;
    }